

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createUserDefinedIOTests(TestContext *testCtx)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  pointer ppTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  int iVar7;
  int iVar8;
  TestCaseGroup *pTVar9;
  IOBlock *pIVar10;
  Variable *pVVar11;
  undefined8 extraout_RAX;
  ostream *poVar12;
  long lVar13;
  int precision;
  int precision_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  long lVar14;
  long lVar15;
  long lVar16;
  TessPrimitiveType TVar17;
  char *__rhs;
  allocator<char> local_8f1;
  TestNode *local_8f0;
  allocator<char> local_8e1;
  int local_8e0;
  uint local_8dc;
  vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  blockMembers;
  allocator<char> local_8b3;
  allocator<char> local_8b2;
  allocator<char> local_8b1;
  StructType *local_8b0;
  undefined4 local_8a4;
  uint local_8a0;
  int local_89c;
  pointer *local_898;
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  *local_890;
  long local_888;
  Variable var0;
  string local_838;
  TestContext *local_818;
  TessPrimitiveType local_80c;
  Variable var1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> vertexArraySizeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> ioTypeGroup;
  VarType highpFloat;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  VarType structVarType;
  string vertexAttrArrayInputSize;
  string inMaybePatch;
  string outMaybePatch;
  CaseDefinition caseDef;
  string local_680;
  string primitiveName;
  undefined1 local_640 [48];
  ostringstream tcsStatements;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600 [22];
  ostringstream tesDeclarations;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488 [22];
  ostringstream tcsDeclarations;
  ostringstream tesStatements;
  
  pTVar9 = (TestCaseGroup *)operator_new(0x70);
  local_818 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar9,testCtx,"user_defined_io",
             "Test non-built-in per-patch and per-vertex inputs and outputs");
  lVar16 = 0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar9;
  do {
    pTVar9 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    if (lVar16 == 6) {
      group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
           = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar9;
    }
    pTVar9 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar9,local_818,createUserDefinedIOTests::ioCases[lVar16].name,
               createUserDefinedIOTests::ioCases[lVar16].description);
    ioTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = pTVar9;
    for (lVar13 = 0;
        pTVar9 = ioTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar13 != 3; lVar13 = lVar13 + 1) {
      local_8f0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_8f0,local_818,
                 createUserDefinedIOTests::vertexArraySizeCases[lVar13].name,"");
      vertexArraySizeGroup.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)local_8f0;
      TVar17 = TESSPRIMITIVETYPE_TRIANGLES;
      while (pTVar9 = vertexArraySizeGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.ptr, TVar17 != TESSPRIMITIVETYPE_LAST) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&primitiveName,(char *)(&DAT_00c09310)[TVar17],
                   (allocator<char> *)&tcsDeclarations);
        caseDef.ioType = createUserDefinedIOTests::ioCases[lVar16].ioType;
        caseDef.vertexIOArraySize =
             createUserDefinedIOTests::vertexArraySizeCases[lVar13].vertexIOArraySize;
        _tesDeclarations = (pointer)local_488;
        local_488[0]._M_local_buf[0] = '\0';
        local_80c = TVar17;
        caseDef.primitiveType = TVar17;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsStatements,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tesDeclarations,"vulkan/data/tessellation/user_defined_io_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsStatements,&primitiveName);
        std::operator+(&caseDef.referenceImagePath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,"_ref.png");
        std::__cxx11::string::~string((string *)&tcsDeclarations);
        std::__cxx11::string::~string((string *)&tcsStatements);
        std::__cxx11::string::~string((string *)&tesDeclarations);
        pTVar9 = vertexArraySizeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr;
        local_8f0 = (TestNode *)operator_new(0x168);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"",&local_8b3);
        anon_unknown_1::CaseDefinition::CaseDefinition((CaseDefinition *)local_640,&caseDef);
        pTVar5 = local_8f0;
        TestCase::TestCase((TestCase *)local_8f0,local_818,&primitiveName,&local_680);
        (((TestCase *)&pTVar5->_vptr_TestNode)->super_TestNode)._vptr_TestNode =
             (_func_int **)&PTR__UserDefinedIOTest_00c09150;
        anon_unknown_1::CaseDefinition::CaseDefinition
                  ((CaseDefinition *)(pTVar5 + 1),(CaseDefinition *)local_640);
        pTVar5[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pTVar5[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)&pTVar5[1].m_nodeType = 0;
        pTVar5[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pTVar5[1].m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar5[1].m_description.field_2 + 8) = 0;
        pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar5[1].m_description._M_string_length = 0;
        (((TestCase *)&pTVar5[2]._vptr_TestNode)->super_TestNode)._vptr_TestNode = (_func_int **)0x0
        ;
        pTVar5[2].m_testCtx = (TestContext *)&pTVar5[2].m_name._M_string_length;
        pTVar5[2].m_name._M_dataplus._M_p = (pointer)0x0;
        local_890 = (vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                     *)((long)&pTVar5[1].m_description.field_2 + 8);
        local_898 = &pTVar5[1].m_children.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        *(undefined1 *)&pTVar5[2].m_name._M_string_length = 0;
        *(size_type **)((long)&pTVar5[2].m_name.field_2 + 8) =
             &pTVar5[2].m_description._M_string_length;
        pTVar5[2].m_description._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)&pTVar5[2].m_description._M_string_length = 0;
        *(vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> **)
         ((long)&pTVar5[2].m_description.field_2 + 8) = &pTVar5[2].m_children;
        *(undefined8 *)&pTVar5[2].m_nodeType = 0;
        *(undefined1 *)
         &pTVar5[2].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        pTVar5[2].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pTVar5[3].m_testCtx;
        (((TestCase *)&pTVar5[3]._vptr_TestNode)->super_TestNode)._vptr_TestNode = (_func_int **)0x0
        ;
        *(undefined1 *)&pTVar5[3].m_testCtx = 0;
        local_8dc = *(uint *)((long)&(((TestCase *)&pTVar5[1]._vptr_TestNode)->super_TestNode).
                                     _vptr_TestNode + 4);
        iVar7 = *(int *)&pTVar5[1].m_testCtx;
        if (iVar7 == 2) {
          _tcsDeclarations = 0x20;
          de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                    (&vertexAttrArrayInputSize,(Constants *)&tcsDeclarations);
        }
        else if (iVar7 == 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexAttrArrayInputSize,"gl_MaxPatchVertices",
                     (allocator<char> *)&tcsStatements);
        }
        else if (iVar7 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexAttrArrayInputSize,"",(allocator<char> *)&tcsStatements);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexAttrArrayInputSize,(char *)0x0,
                     (allocator<char> *)&tcsStatements);
        }
        __rhs = "";
        if (local_8dc < 4) {
          __rhs = "patch ";
        }
        _tcsStatements = (pointer)local_600;
        local_600[0]._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsStatements,__rhs);
        std::operator+(&outMaybePatch,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,"out ");
        std::__cxx11::string::~string((string *)&tcsDeclarations);
        std::__cxx11::string::~string((string *)&tcsStatements);
        _tcsStatements = (pointer)local_600;
        local_600[0]._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsStatements,__rhs);
        std::operator+(&inMaybePatch,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tcsDeclarations,"in ");
        local_8a0 = iVar7;
        std::__cxx11::string::~string((string *)&tcsDeclarations);
        std::__cxx11::string::~string((string *)&tcsStatements);
        uVar1 = *(uint *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                 _vptr_TestNode + 4);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tcsDeclarations);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tcsStatements);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tesDeclarations);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tesStatements);
        glu::StructType::StructType((StructType *)&var0,"S");
        std::vector<glu::StructType,_std::allocator<glu::StructType>_>::
        emplace_back<glu::StructType>
                  ((vector<glu::StructType,_std::allocator<glu::StructType>_> *)
                   &pTVar5[1].m_description,(StructType *)&var0);
        glu::StructType::~StructType((StructType *)&var0);
        glu::VarType::VarType(&highpFloat,TYPE_FLOAT,PRECISION_HIGHP);
        local_8b0 = (StructType *)(local_8f0[1].m_description._M_string_length - 0x38);
        glu::VarType::VarType(&structVarType,local_8b0);
        glu::VarType::VarType((VarType *)&var0,TYPE_INT,PRECISION_HIGHP);
        glu::StructType::addMember(local_8b0,"x",(VarType *)&var0);
        glu::VarType::~VarType((VarType *)&var0);
        glu::VarType::VarType((VarType *)&var0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
        glu::StructType::addMember(local_8b0,"y",(VarType *)&var0);
        glu::VarType::~VarType((VarType *)&var0);
        if ((uVar1 < 6 & 0x2cU >> ((byte)uVar1 & 0x1f)) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&var1,"in_te_s",(allocator<char> *)&blockMembers);
          anon_unknown_1::Variable::Variable
                    (&var0,(string *)&var1,&structVarType,
                     *(int *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                     _vptr_TestNode + 4) != 0);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blockMembers,"in_te_f",(allocator<char> *)&local_838);
          pTVar6 = local_8f0;
          anon_unknown_1::Variable::Variable
                    (&var1,(string *)&blockMembers,&highpFloat,
                     *(int *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                     _vptr_TestNode + 4) != 0);
          std::__cxx11::string::~string((string *)&blockMembers);
          iVar7 = *(int *)((long)&(((TestCase *)&pTVar6[1]._vptr_TestNode)->super_TestNode).
                                  _vptr_TestNode + 4);
          if (iVar7 != 1) {
            pVVar11 = (Variable *)operator_new(0x48);
            anon_unknown_1::Variable::Variable(pVVar11,&var0);
            de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                      ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                       &blockMembers,(TopLevelObject *)pVVar11);
            std::
            vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
            ::push_back(local_890,
                        (SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                        &blockMembers);
            de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                      ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                       &blockMembers);
            pVVar11 = (Variable *)operator_new(0x48);
            anon_unknown_1::Variable::Variable(pVVar11,&var0);
            de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                      ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                       &blockMembers,(TopLevelObject *)pVVar11);
            std::
            vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
            ::push_back((vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                         *)local_898,
                        (SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                        &blockMembers);
            de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                      ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                       &blockMembers);
          }
          pVVar11 = (Variable *)operator_new(0x48);
          anon_unknown_1::Variable::Variable(pVVar11,&var1);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &blockMembers,(TopLevelObject *)pVVar11);
          std::
          vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
          ::push_back(local_890,
                      (SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                      &blockMembers);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &blockMembers);
          pVVar11 = (Variable *)operator_new(0x48);
          anon_unknown_1::Variable::Variable(pVVar11,&var1);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &blockMembers,(TopLevelObject *)pVVar11);
          std::
          vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
          ::push_back((vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                       *)local_898,
                      (SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                      &blockMembers);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &blockMembers);
          anon_unknown_1::Variable::~Variable(&var1);
          anon_unknown_1::Variable::~Variable(&var0);
          if (iVar7 != 1) goto LAB_00730257;
          local_8a4 = 0;
        }
        else {
          glu::VarType::VarType((VarType *)&var0,&highpFloat,2);
          glu::StructType::addMember(local_8b0,"z",(VarType *)&var0);
          glu::VarType::~VarType((VarType *)&var0);
          blockMembers.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          blockMembers.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          blockMembers.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if (*(int *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                              _vptr_TestNode + 4) != 3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&var1,"blockS",(allocator<char> *)&local_838);
            anon_unknown_1::IOBlock::Member::Member((Member *)&var0,(string *)&var1,&structVarType);
            std::
            vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
            ::push_back(&blockMembers,(value_type *)&var0);
            anon_unknown_1::IOBlock::Member::~Member((Member *)&var0);
            std::__cxx11::string::~string((string *)&var1);
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"blockFa",&local_8f1);
          glu::VarType::VarType((VarType *)&local_838,&highpFloat,3);
          anon_unknown_1::IOBlock::Member::Member
                    ((Member *)&var0,(string *)&var1,(VarType *)&local_838);
          std::
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ::push_back(&blockMembers,(value_type *)&var0);
          anon_unknown_1::IOBlock::Member::~Member((Member *)&var0);
          glu::VarType::~VarType((VarType *)&local_838);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"blockSa",&local_8f1);
          glu::VarType::VarType((VarType *)&local_838,&structVarType,2);
          anon_unknown_1::IOBlock::Member::Member
                    ((Member *)&var0,(string *)&var1,(VarType *)&local_838);
          std::
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ::push_back(&blockMembers,(value_type *)&var0);
          anon_unknown_1::IOBlock::Member::~Member((Member *)&var0);
          glu::VarType::~VarType((VarType *)&local_838);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&var1,"blockF",(allocator<char> *)&local_838);
          anon_unknown_1::IOBlock::Member::Member((Member *)&var0,(string *)&var1,&highpFloat);
          std::
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ::push_back(&blockMembers,(value_type *)&var0);
          anon_unknown_1::IOBlock::Member::~Member((Member *)&var0);
          std::__cxx11::string::~string((string *)&var1);
          pIVar10 = (IOBlock *)operator_new(0x60);
          std::__cxx11::string::string<std::allocator<char>>((string *)&var0,"TheBlock",&local_8f1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"tcBlock",&local_8e1);
          anon_unknown_1::IOBlock::IOBlock(pIVar10,(string *)&var0,(string *)&var1,&blockMembers);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &local_838,(TopLevelObject *)pIVar10);
          std::
          vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
          ::push_back(local_890,(value_type *)&local_838);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &local_838);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::~string((string *)&var0);
          pIVar10 = (IOBlock *)operator_new(0x60);
          std::__cxx11::string::string<std::allocator<char>>((string *)&var0,"TheBlock",&local_8f1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"teBlock",&local_8e1);
          anon_unknown_1::IOBlock::IOBlock(pIVar10,(string *)&var0,(string *)&var1,&blockMembers);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &local_838,(TopLevelObject *)pIVar10);
          std::
          vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
          ::push_back((vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                       *)local_898,(value_type *)&local_838);
          de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                    ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)
                     &local_838);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::~string((string *)&var0);
          std::
          vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
          ::~vector(&blockMembers);
LAB_00730257:
          glu::StructType::StructType((StructType *)&var0,local_8b0);
          var0.m_type.m_data.array.size = 0;
          de::toString<glu::decl::DeclareStructType>
                    ((string *)&blockMembers,(DeclareStructType *)&var0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                         (string *)&blockMembers,";\n");
          std::operator<<((ostream *)&tcsDeclarations,(string *)&var1);
          std::__cxx11::string::~string((string *)&var1);
          std::__cxx11::string::~string((string *)&blockMembers);
          glu::StructType::~StructType((StructType *)&var0);
          local_8a4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        poVar12 = std::operator<<((ostream *)&tcsStatements,"\t{\n");
        std::operator<<(poVar12,"\t\thighp float v = 1.3;\n");
        lVar15 = 0;
        local_89c = 2;
        lVar14 = 0;
        while( true ) {
          lVar2 = *(long *)((long)&local_8f0[1].m_description.field_2 + 8);
          if ((int)((ulong)(*(long *)&local_8f0[1].m_nodeType - lVar2) >> 4) <= lVar15) break;
          local_8e0 = -1;
          if (local_8dc < 4) {
            uVar1 = *(uint *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                     _vptr_TestNode + 4);
            if ((ulong)uVar1 < 3) {
              local_8e0 = *(int *)(&DAT_009e5c48 + (ulong)uVar1 * 4);
            }
            else {
              local_8e0 = (uint)(uVar1 == 3) * 4 + -2;
            }
          }
          plVar3 = *(long **)(lVar2 + lVar14);
          local_888 = lVar15;
          poVar12 = std::operator<<((ostream *)&tcsDeclarations,"layout(location = ");
          lVar15 = local_888;
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_89c);
          std::operator<<(poVar12,") ");
          if (local_8e0 == 1) {
            poVar12 = std::operator<<((ostream *)&tcsDeclarations,(string *)&outMaybePatch);
            (**(code **)(*plVar3 + 0x18))(&var0,plVar3);
            std::operator<<(poVar12,(string *)&var0);
            std::__cxx11::string::~string((string *)&var0);
          }
          else {
            poVar12 = std::operator<<((ostream *)&tcsDeclarations,(string *)&outMaybePatch);
            iVar7 = *(int *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                    _vptr_TestNode + 4);
            if (iVar7 == 3) {
              local_838._M_dataplus._M_p._0_4_ = 2;
              de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                        ((string *)&var1,(Constants *)&local_838);
            }
            else if (iVar7 == 1) {
              blockMembers.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(blockMembers.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
              de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                        ((string *)&var1,(Constants *)&blockMembers);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"",&local_8b1);
            }
            (**(code **)(*plVar3 + 0x20))(&var0,plVar3,&var1);
            std::operator<<(poVar12,(string *)&var0);
            std::__cxx11::string::~string((string *)&var0);
            std::__cxx11::string::~string((string *)&var1);
            lVar15 = local_888;
          }
          iVar7 = (**(code **)(*plVar3 + 0x38))(plVar3);
          if (3 < local_8dc) {
            poVar12 = std::operator<<((ostream *)&tcsStatements,"\t\tv += float(gl_InvocationID)*");
            iVar8 = (**(code **)(*plVar3 + 0x38))(plVar3);
            de::floatToString_abi_cxx11_((string *)&var0,(de *)0x1,(float)iVar8 * 0.4,precision);
            poVar12 = std::operator<<(poVar12,(string *)&var0);
            std::operator<<(poVar12,";\n");
            std::__cxx11::string::~string((string *)&var0);
          }
          poVar12 = std::operator<<((ostream *)&tcsStatements,"\n\t\t// Assign values to output ");
          (**(code **)(*plVar3 + 0x10))(&var0,plVar3);
          poVar12 = std::operator<<(poVar12,(string *)&var0);
          std::operator<<(poVar12,"\n");
          std::__cxx11::string::~string((string *)&var0);
          if (local_8e0 == 1) {
            (**(code **)(*plVar3 + 0x30))(&var0,plVar3,2,anon_unknown_1::glslAssignBasicTypeObject);
            std::operator<<((ostream *)&tcsStatements,(string *)&var0);
          }
          else {
            (**(code **)(*plVar3 + 0x28))
                      (&var0,plVar3,local_8e0,2,anon_unknown_1::glslAssignBasicTypeObject);
            std::operator<<((ostream *)&tcsStatements,(string *)&var0);
          }
          std::__cxx11::string::~string((string *)&var0);
          if (3 < local_8dc) {
            poVar12 = std::operator<<((ostream *)&tcsStatements,"\t\tv += float(");
            blockMembers.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(blockMembers.
                                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
            de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                      ((string *)&var0,(Constants *)&blockMembers);
            poVar12 = std::operator<<(poVar12,(string *)&var0);
            poVar12 = std::operator<<(poVar12,"-gl_InvocationID-1)*");
            iVar8 = (**(code **)(*plVar3 + 0x38))(plVar3);
            de::floatToString_abi_cxx11_((string *)&var1,(de *)0x1,(float)iVar8 * 0.4,precision_00);
            poVar12 = std::operator<<(poVar12,(string *)&var1);
            std::operator<<(poVar12,";\n");
            std::__cxx11::string::~string((string *)&var1);
            std::__cxx11::string::~string((string *)&var0);
          }
          local_89c = local_89c + iVar7;
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 0x10;
        }
        std::operator<<((ostream *)&tcsStatements,"\t}\n");
        poVar12 = std::operator<<((ostream *)&tcsDeclarations,"\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"in_tc_attr",&local_8f1);
        anon_unknown_1::Variable::Variable(&var0,&local_838,&highpFloat,true);
        anon_unknown_1::Variable::declareArray
                  ((string *)&blockMembers,&var0,&vertexAttrArrayInputSize);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var1,
                       "layout(location = 0) in ",(string *)&blockMembers);
        std::operator<<(poVar12,(string *)&var1);
        std::__cxx11::string::~string((string *)&var1);
        std::__cxx11::string::~string((string *)&blockMembers);
        anon_unknown_1::Variable::~Variable(&var0);
        std::__cxx11::string::~string((string *)&local_838);
        if ((char)local_8a4 != '\0') {
          glu::StructType::StructType((StructType *)&var0,local_8b0);
          var0.m_type.m_data.array.size = 0;
          de::toString<glu::decl::DeclareStructType>((string *)&var1,(DeclareStructType *)&var0);
          poVar12 = std::operator<<((ostream *)&tesDeclarations,(string *)&var1);
          std::operator<<(poVar12,";\n");
          std::__cxx11::string::~string((string *)&var1);
          glu::StructType::~StructType((StructType *)&var0);
        }
        poVar12 = std::operator<<((ostream *)&tesStatements,"\tbool allOk = true;\n");
        poVar12 = std::operator<<(poVar12,"\thighp uint firstFailedInputIndex = 0u;\n");
        poVar12 = std::operator<<(poVar12,"\t{\n");
        std::operator<<(poVar12,"\t\thighp float v = 1.3;\n");
        local_8a0 = local_8a0 - 1;
        lVar14 = 0;
        lVar15 = 0;
        local_8e0 = 2;
        while( true ) {
          ppTVar4 = local_8f0[1].m_children.
                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if ((int)((ulong)((long)local_8f0[1].m_children.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar4
                           ) >> 4) <= lVar15) break;
          iVar7 = 5;
          if (local_8dc < 4) {
            uVar1 = *(uint *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                     _vptr_TestNode + 4);
            if ((ulong)uVar1 < 3) {
              iVar7 = *(int *)(&DAT_009e5c48 + (ulong)uVar1 * 4);
            }
            else {
              iVar7 = (uint)(uVar1 == 3) * 4 + -2;
            }
          }
          plVar3 = *(long **)((long)ppTVar4 + lVar14);
          local_888 = lVar15;
          poVar12 = std::operator<<((ostream *)&tesDeclarations,"layout(location = ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_8e0);
          std::operator<<(poVar12,") ");
          if (iVar7 == 1) {
            (**(code **)(*plVar3 + 0x18))(&var1,plVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &var0,&inMaybePatch,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &var1);
            std::operator<<((ostream *)&tesDeclarations,(string *)&var0);
            std::__cxx11::string::~string((string *)&var0);
            std::__cxx11::string::~string((string *)&var1);
          }
          else {
            poVar12 = std::operator<<((ostream *)&tesDeclarations,(string *)&inMaybePatch);
            iVar8 = *(int *)((long)&(((TestCase *)&local_8f0[1]._vptr_TestNode)->super_TestNode).
                                    _vptr_TestNode + 4);
            if (iVar8 == 3) {
              local_838._M_dataplus._M_p._0_4_ = 2;
              de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                        ((string *)&var1,(Constants *)&local_838);
            }
            else if (iVar8 == 1) {
              blockMembers.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(blockMembers.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
              de::toString<vkt::tessellation::(anonymous_namespace)::Constants>
                        ((string *)&var1,(Constants *)&blockMembers);
            }
            else if (local_8a0 < 2) {
              de::toString<std::__cxx11::string>
                        ((string *)&var1,(de *)&vertexAttrArrayInputSize,value);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>((string *)&var1,"",&local_8b2);
            }
            (**(code **)(*plVar3 + 0x20))(&var0,plVar3,&var1);
            std::operator<<(poVar12,(string *)&var0);
            std::__cxx11::string::~string((string *)&var0);
            std::__cxx11::string::~string((string *)&var1);
          }
          iVar8 = (**(code **)(*plVar3 + 0x38))(plVar3);
          poVar12 = std::operator<<((ostream *)&tesStatements,"\n\t\t// Check values in input ");
          (**(code **)(*plVar3 + 0x10))(&var0,plVar3);
          poVar12 = std::operator<<(poVar12,(string *)&var0);
          std::operator<<(poVar12,"\n");
          std::__cxx11::string::~string((string *)&var0);
          if (iVar7 == 1) {
            (**(code **)(*plVar3 + 0x30))(&var0,plVar3,2,anon_unknown_1::glslCheckBasicTypeObject);
            std::operator<<((ostream *)&tesStatements,(string *)&var0);
          }
          else {
            (**(code **)(*plVar3 + 0x28))
                      (&var0,plVar3,iVar7,2,anon_unknown_1::glslCheckBasicTypeObject);
            std::operator<<((ostream *)&tesStatements,(string *)&var0);
          }
          std::__cxx11::string::~string((string *)&var0);
          local_8e0 = local_8e0 + iVar8;
          lVar15 = local_888 + 1;
          lVar14 = lVar14 + 0x10;
        }
        std::operator<<((ostream *)&tesStatements,"\t}\n");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&pTVar5[2].m_testCtx,(string *)&var0);
        std::__cxx11::string::~string((string *)&var0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)(pTVar5[2].m_name.field_2._M_local_buf + 8),(string *)&var0);
        std::__cxx11::string::~string((string *)&var0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)(pTVar5[2].m_description.field_2._M_local_buf + 8),(string *)&var0);
        std::__cxx11::string::~string((string *)&var0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)
                   &pTVar5[2].m_children.
                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)&var0);
        std::__cxx11::string::~string((string *)&var0);
        glu::VarType::~VarType(&structVarType);
        glu::VarType::~VarType(&highpFloat);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tesStatements);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tesDeclarations);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tcsStatements);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tcsDeclarations);
        std::__cxx11::string::~string((string *)&inMaybePatch);
        std::__cxx11::string::~string((string *)&outMaybePatch);
        std::__cxx11::string::~string((string *)&vertexAttrArrayInputSize);
        tcu::TestNode::addChild(&pTVar9->super_TestNode,local_8f0);
        std::__cxx11::string::~string((string *)(local_640 + 0x10));
        std::__cxx11::string::~string((string *)&local_680);
        std::__cxx11::string::~string((string *)&caseDef.referenceImagePath);
        std::__cxx11::string::~string((string *)&primitiveName);
        TVar17 = local_80c + TESSPRIMITIVETYPE_QUADS;
      }
      vertexArraySizeGroup.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild
                (&(ioTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr)->super_TestNode,&pTVar9->super_TestNode);
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&vertexArraySizeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    }
    ioTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
    .ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr)->super_TestNode,&pTVar9->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&ioTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createUserDefinedIOTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs"));

	static const struct
	{
		const char*	name;
		const char*	description;
		IOType		ioType;
	} ioCases[] =
	{
		{ "per_patch",					"Per-patch TCS outputs",					IO_TYPE_PER_PATCH				},
		{ "per_patch_array",			"Per-patch array TCS outputs",				IO_TYPE_PER_PATCH_ARRAY			},
		{ "per_patch_block",			"Per-patch TCS outputs in IO block",		IO_TYPE_PER_PATCH_BLOCK			},
		{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
		{ "per_vertex",					"Per-vertex TCS outputs",					IO_TYPE_PER_VERTEX				},
		{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		IO_TYPE_PER_VERTEX_BLOCK		},
	};

	static const struct
	{
		const char*			name;
		VertexIOArraySize	vertexIOArraySize;
	} vertexArraySizeCases[] =
	{
		{ "vertex_io_array_size_implicit",			VERTEX_IO_ARRAY_SIZE_IMPLICIT					},
		{ "vertex_io_array_size_shader_builtin",	VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	},
		{ "vertex_io_array_size_spec_min",			VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN			},
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(ioCases); ++caseNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> ioTypeGroup (new tcu::TestCaseGroup(testCtx, ioCases[caseNdx].name, ioCases[caseNdx].description));
		for (int arrayCaseNdx = 0; arrayCaseNdx < DE_LENGTH_OF_ARRAY(vertexArraySizeCases); ++arrayCaseNdx)
		{
			de::MovePtr<tcu::TestCaseGroup> vertexArraySizeGroup (new tcu::TestCaseGroup(testCtx, vertexArraySizeCases[arrayCaseNdx].name, ""));
			for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
			{
				const TessPrimitiveType primitiveType = static_cast<TessPrimitiveType>(primitiveTypeNdx);
				const std::string		primitiveName = getTessPrimitiveTypeShaderName(primitiveType);
				const CaseDefinition	caseDef		  = { primitiveType, ioCases[caseNdx].ioType, vertexArraySizeCases[arrayCaseNdx].vertexIOArraySize,
														  std::string() + "vulkan/data/tessellation/user_defined_io_" + primitiveName + "_ref.png" };

				vertexArraySizeGroup->addChild(new UserDefinedIOTest(testCtx, primitiveName, "", caseDef));
			}
			ioTypeGroup->addChild(vertexArraySizeGroup.release());
		}
		group->addChild(ioTypeGroup.release());
	}

	return group.release();
}